

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_top_n.cpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalTopN *op)

{
  pointer *pprVar1;
  iterator __position;
  reference this_00;
  type op_00;
  pointer this_01;
  PhysicalOperator *pPVar2;
  reference_wrapper<duckdb::PhysicalOperator> local_48;
  PhysicalOperator *local_40;
  idx_t local_38;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](&(op->super_LogicalOperator).children,0);
  op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator*(this_00);
  local_40 = CreatePlan(this,op_00);
  local_48._M_data = (PhysicalOperator *)op->limit;
  local_38 = op->offset;
  this_01 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
            operator->(&this->physical_plan);
  pPVar2 = PhysicalPlan::
           Make<duckdb::PhysicalTopN,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::BoundOrderByNode,true>,unsigned_long,unsigned_long,duckdb::shared_ptr<duckdb::DynamicFilterData,true>,unsigned_long&>
                     (this_01,&(op->super_LogicalOperator).types,&op->orders,
                      (unsigned_long *)&local_48,&local_38,&op->dynamic_filter,
                      &(op->super_LogicalOperator).estimated_cardinality);
  local_48._M_data = local_40;
  __position._M_current =
       (pPVar2->children).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pPVar2->children).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&pPVar2->children,__position,&local_48);
  }
  else {
    (__position._M_current)->_M_data = local_40;
    pprVar1 = &(pPVar2->children).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return pPVar2;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalTopN &op) {
	D_ASSERT(op.children.size() == 1);
	auto &plan = CreatePlan(*op.children[0]);
	auto &top_n =
	    Make<PhysicalTopN>(op.types, std::move(op.orders), NumericCast<idx_t>(op.limit), NumericCast<idx_t>(op.offset),
	                       std::move(op.dynamic_filter), op.estimated_cardinality);
	top_n.children.push_back(plan);
	return top_n;
}